

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O2

uint8_t * __thiscall jrtplib::RTCPSDESPacket::GetPRIVPrefixData(RTCPSDESPacket *this)

{
  uint8_t *puVar1;
  size_t sVar2;
  uint8_t *puVar3;
  
  if ((((this->super_RTCPPacket).knownformat == true) &&
      (puVar1 = this->currentchunk, puVar1 != (uint8_t *)0x0)) &&
     (sVar2 = this->itemoffset, puVar1[sVar2] == '\b')) {
    if (puVar1[sVar2 + 1] != 0) {
      puVar3 = (uint8_t *)0x0;
      if ((uint)puVar1[sVar2 + 2] <= puVar1[sVar2 + 1] - 1) {
        puVar3 = puVar1 + sVar2 + 3;
      }
      if (puVar1[sVar2 + 2] == 0) {
        puVar3 = (uint8_t *)0x0;
      }
      return puVar3;
    }
  }
  return (uint8_t *)0x0;
}

Assistant:

inline uint8_t *RTCPSDESPacket::GetPRIVPrefixData()
{
	if (!knownformat)
		return 0;
	if (currentchunk == 0)
		return 0;
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	if (sdeshdr->sdesid != RTCP_SDES_ID_PRIVATE)
		return 0;
	if (sdeshdr->length == 0)
		return 0;
	uint8_t *preflen = currentchunk+itemoffset+sizeof(RTCPSDESHeader);
	size_t prefixlength = (size_t)(*preflen);
	if (prefixlength > (size_t)((sdeshdr->length)-1))
		return 0;
	if (prefixlength == 0)
		return 0;
	return (currentchunk+itemoffset+sizeof(RTCPSDESHeader)+1);
}